

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

int fy_vdiag(fy_diag *diag,fy_diag_ctx *fydc,char *fmt,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  fy_error_type fVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  char *__s;
  ulong uVar17;
  char *pcVar18;
  undefined8 uStack_80;
  undefined8 uStack_78;
  va_list _ap_orig;
  char *local_50;
  char *local_48;
  
  __s = (char *)&uStack_78;
  iVar4 = -1;
  if (fmt != (char *)0x0 && (fydc != (fy_diag_ctx *)0x0 && diag != (fy_diag *)0x0)) {
    fVar13 = fydc->level;
    if ((FYET_WARNING < fVar13) && ((diag->field_0x3c & 1) != 0)) {
      fVar13 = FYET_NOTICE;
    }
    iVar4 = 0;
    if (((diag->cfg).level <= fVar13) &&
       (iVar4 = 0, ((diag->cfg).module_mask >> (fydc->module & 0x1f) & 1) != 0)) {
      _ap_orig[0].overflow_arg_area = ap->reg_save_area;
      uStack_78._0_4_ = ap->gp_offset;
      uStack_78._4_4_ = ap->fp_offset;
      _ap_orig[0]._0_8_ = ap->overflow_arg_area;
      local_50 = (char *)0x0;
      uStack_80 = 0x11a776;
      iVar4 = vsnprintf((char *)0x0,0,fmt,&uStack_78);
      if (iVar4 != -1) {
        lVar3 = -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
        __s = (char *)((long)_ap_orig + lVar3 + -8);
        *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11a7a7;
        iVar5 = vsnprintf(__s,(long)iVar4 + 1,fmt,ap);
        if (iVar4 != iVar5) {
          *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11ac23;
          __assert_fail("_size == _sizew",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                        ,0x10a,
                        "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                       );
        }
        *(undefined8 *)((long)&uStack_80 + lVar3) = 0x11a7b8;
        sVar6 = strlen(__s);
        local_50 = __s;
        if (0 < (long)sVar6) {
          pcVar7 = __s + sVar6;
          do {
            if (pcVar7[-1] != '\n') break;
            pcVar7 = pcVar7 + -1;
            *pcVar7 = '\0';
          } while (__s < pcVar7);
        }
      }
      if (((diag->cfg).field_0x20 & 2) == 0) {
        local_48 = (char *)0x0;
      }
      else {
        pcVar7 = fydc->source_file;
        if (pcVar7 == (char *)0x0) {
          pcVar8 = "";
        }
        else {
          __s[-8] = '\x02';
          __s[-7] = -0x58;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          pcVar9 = strrchr(pcVar7,0x2f);
          pcVar8 = pcVar9 + 1;
          if (pcVar9 == (char *)0x0) {
            pcVar8 = pcVar7;
          }
        }
        uVar1 = fydc->source_line;
        pcVar7 = fydc->source_func;
        local_48 = (char *)0x0;
        *(char **)(__s + -0x10) = " ";
        __s[-0x18] = 'H';
        __s[-0x17] = -0x58;
        __s[-0x16] = '\x11';
        __s[-0x15] = '\0';
        __s[-0x14] = '\0';
        __s[-0x13] = '\0';
        __s[-0x12] = '\0';
        __s[-0x11] = '\0';
        iVar4 = snprintf((char *)0x0,0,"%s:%d @%s()%s",pcVar8,(ulong)uVar1,pcVar7);
        if (iVar4 != -1) {
          __s = __s + -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          uVar1 = fydc->source_line;
          pcVar7 = fydc->source_func;
          *(char **)(__s + -0x10) = " ";
          __s[-0x18] = -0x70;
          __s[-0x17] = -0x58;
          __s[-0x16] = '\x11';
          __s[-0x15] = '\0';
          __s[-0x14] = '\0';
          __s[-0x13] = '\0';
          __s[-0x12] = '\0';
          __s[-0x11] = '\0';
          iVar5 = snprintf(__s,(long)iVar4 + 1,"%s:%d @%s()%s",pcVar8,(ulong)uVar1,pcVar7);
          if (iVar4 != iVar5) {
            __s[-8] = 'B';
            __s[-7] = -0x54;
            __s[-6] = '\x11';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x117,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          __s[-8] = -0x5b;
          __s[-7] = -0x58;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          sVar6 = strlen(__s);
          local_48 = __s;
          if (0 < (long)sVar6) {
            pcVar7 = __s + sVar6;
            do {
              if (pcVar7[-1] != '\n') break;
              pcVar7 = pcVar7 + -1;
              *pcVar7 = '\0';
            } while (__s < pcVar7);
          }
        }
      }
      if (((((diag->cfg).field_0x20 & 4) == 0) || (uVar1 = fydc->line, (int)uVar1 < 0)) ||
         (uVar2 = fydc->column, (int)uVar2 < 0)) {
        pcVar7 = (char *)0x0;
      }
      else {
        __s[-8] = '\x01';
        __s[-7] = -0x57;
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        iVar4 = snprintf((char *)0x0,0,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
        pcVar7 = (char *)0x0;
        if (iVar4 != -1) {
          __s = __s + -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          uVar1 = fydc->line;
          uVar2 = fydc->column;
          __s[-8] = '@';
          __s[-7] = -0x57;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar5 = snprintf(__s,(long)iVar4 + 1,"<%3d:%2d>%s",(ulong)uVar1,(ulong)uVar2,": ");
          if (iVar4 != iVar5) {
            *(code **)(__s + -8) = fy_diagf;
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x11c,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          __s[-8] = 'Q';
          __s[-7] = -0x57;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          sVar6 = strlen(__s);
          pcVar7 = __s;
          if (0 < (long)sVar6) {
            pcVar8 = __s + sVar6;
            do {
              if (pcVar8[-1] != '\n') break;
              pcVar8 = pcVar8 + -1;
              *pcVar8 = '\0';
            } while (__s < pcVar8);
          }
        }
      }
      if (((diag->cfg).field_0x20 & 8) == 0) {
        pcVar8 = (char *)0x0;
      }
      else {
        if (fVar13 < FYET_MAX) {
          pcVar8 = *(char **)(fy_error_level_str_txt + (ulong)fVar13 * 8);
        }
        else {
          pcVar8 = "*unknown*";
        }
        __s[-8] = -0x46;
        __s[-7] = -0x57;
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        iVar4 = snprintf((char *)0x0,0,"[%s]%s",pcVar8,": ");
        pcVar8 = (char *)0x0;
        if (iVar4 != -1) {
          __s = __s + -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          if (fVar13 < FYET_MAX) {
            pcVar8 = *(char **)(fy_error_level_str_txt + (ulong)fVar13 * 8);
          }
          else {
            pcVar8 = "*unknown*";
          }
          __s[-8] = '\x14';
          __s[-7] = -0x56;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar5 = snprintf(__s,(long)iVar4 + 1,"[%s]%s",pcVar8,": ");
          if (iVar4 != iVar5) {
            __s[-8] = 'a';
            __s[-7] = -0x54;
            __s[-6] = '\x11';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x120,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          __s[-8] = '%';
          __s[-7] = -0x56;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          sVar6 = strlen(__s);
          pcVar8 = __s;
          if (0 < (long)sVar6) {
            pcVar9 = __s + sVar6;
            do {
              if (pcVar9[-1] != '\n') break;
              pcVar9 = pcVar9 + -1;
              *pcVar9 = '\0';
            } while (__s < pcVar9);
          }
        }
      }
      if (((diag->cfg).field_0x20 & 0x10) == 0) {
        pcVar9 = (char *)0x0;
      }
      else {
        if ((ulong)fydc->module < 8) {
          pcVar9 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
        }
        else {
          pcVar9 = "*unknown*";
        }
        __s[-8] = -0x6f;
        __s[-7] = -0x56;
        __s[-6] = '\x11';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        iVar4 = snprintf((char *)0x0,0,"<%s>%s",pcVar9,": ");
        pcVar9 = (char *)0x0;
        if (iVar4 != -1) {
          __s = __s + -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          if ((ulong)fydc->module < 8) {
            pcVar9 = *(char **)(fy_error_module_str_txt + (ulong)fydc->module * 8);
          }
          else {
            pcVar9 = "*unknown*";
          }
          __s[-8] = -0x13;
          __s[-7] = -0x56;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          iVar5 = snprintf(__s,(long)iVar4 + 1,"<%s>%s",pcVar9,": ");
          if (iVar4 != iVar5) {
            __s[-8] = -0x80;
            __s[-7] = -0x54;
            __s[-6] = '\x11';
            __s[-5] = '\0';
            __s[-4] = '\0';
            __s[-3] = '\0';
            __s[-2] = '\0';
            __s[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-diag.c"
                          ,0x124,
                          "int fy_vdiag(struct fy_diag *, const struct fy_diag_ctx *, const char *, struct __va_list_tag *)"
                         );
          }
          __s[-8] = -2;
          __s[-7] = -0x56;
          __s[-6] = '\x11';
          __s[-5] = '\0';
          __s[-4] = '\0';
          __s[-3] = '\0';
          __s[-2] = '\0';
          __s[-1] = '\0';
          sVar6 = strlen(__s);
          pcVar9 = __s;
          if (0 < (long)sVar6) {
            pcVar12 = __s + sVar6;
            do {
              if (pcVar12[-1] != '\n') break;
              pcVar12 = pcVar12 + -1;
              *pcVar12 = '\0';
            } while (__s < pcVar12);
          }
        }
      }
      pcVar10 = "";
      pcVar12 = "";
      if (fVar13 < FYET_MAX) {
        pcVar10 = "";
        pcVar12 = "";
        if (((diag->cfg).field_0x20 & 1) != 0) {
          pcVar12 = (&PTR_anon_var_dwarf_f5b0_00157bd0)[fVar13];
          pcVar10 = "\x1b[0m";
        }
      }
      uVar15 = 0;
      uVar11 = 0;
      pcVar14 = "";
      if (local_48 != (char *)0x0) {
        uVar11 = (ulong)(uint)(diag->cfg).source_width;
        pcVar14 = local_48;
      }
      pcVar18 = "";
      if (pcVar7 != (char *)0x0) {
        uVar15 = (ulong)(uint)(diag->cfg).position_width;
        pcVar18 = pcVar7;
      }
      uVar17 = 0;
      uVar16 = 0;
      pcVar7 = "";
      if (pcVar8 != (char *)0x0) {
        uVar16 = (ulong)(uint)(diag->cfg).type_width;
        pcVar7 = pcVar8;
      }
      pcVar8 = "";
      if (pcVar9 != (char *)0x0) {
        uVar17 = (ulong)(uint)(diag->cfg).module_width;
        pcVar8 = pcVar9;
      }
      *(char **)(__s + -0x10) = pcVar10;
      *(char **)(__s + -0x18) = local_50;
      *(char **)(__s + -0x20) = pcVar8;
      *(ulong *)(__s + -0x28) = uVar17;
      *(char **)(__s + -0x30) = pcVar7;
      *(ulong *)(__s + -0x38) = uVar16;
      *(char **)(__s + -0x40) = pcVar18;
      __s[-0x48] = -0x32;
      __s[-0x47] = -0x55;
      __s[-0x46] = '\x11';
      __s[-0x45] = '\0';
      __s[-0x44] = '\0';
      __s[-0x43] = '\0';
      __s[-0x42] = '\0';
      __s[-0x41] = '\0';
      iVar4 = fy_diag_printf(diag,"%s%*s%*s%*s%*s%s%s\n",pcVar12,uVar11,pcVar14,uVar15);
      iVar4 = (uint)(0 < iVar4) + iVar4;
    }
    if (((diag->field_0x3c & 1) == 0) && (FYET_WARNING < fydc->level)) {
      diag->field_0x3c = diag->field_0x3c | 1;
    }
  }
  return iVar4;
}

Assistant:

int fy_vdiag(struct fy_diag *diag, const struct fy_diag_ctx *fydc,
             const char *fmt, va_list ap) {
    char *msg = NULL;
    char *source = NULL, *position = NULL, *typestr = NULL, *modulestr = NULL;
    const char *file_stripped = NULL;
    const char *color_start = NULL, *color_end = NULL;
    enum fy_error_type level;
    int rc;

    if (!diag || !fydc || !fmt)
        return -1;

    level = fydc->level;

    /* turn errors into notices while not reset */
    if (level >= FYET_ERROR && diag->on_error)
        level = FYET_NOTICE;

    if (level < diag->cfg.level) {
        rc = 0;
        goto out;
    }

    /* check module enable mask */
    if (!(diag->cfg.module_mask & FY_BIT(fydc->module))) {
        rc = 0;
        goto out;
    }

    msg = alloca_vsprintf(fmt, ap);

    /* source part */
    if (diag->cfg.show_source) {
        if (fydc->source_file) {
            file_stripped = strrchr(fydc->source_file, '/');
            if (!file_stripped)
                file_stripped = fydc->source_file;
            else
                file_stripped++;
        } else
            file_stripped = "";
        source = alloca_sprintf("%s:%d @%s()%s",
                                file_stripped, fydc->source_line, fydc->source_func, " ");
    }

    /* position part */
    if (diag->cfg.show_position && fydc->line >= 0 && fydc->column >= 0)
        position = alloca_sprintf("<%3d:%2d>%s", fydc->line, fydc->column, ": ");

    /* type part */
    if (diag->cfg.show_type)
        typestr = alloca_sprintf("[%s]%s", fy_error_level_str(level), ": ");

    /* module part */
    if (diag->cfg.show_module)
        modulestr = alloca_sprintf("<%s>%s", fy_error_module_str(fydc->module), ": ");

    if (diag->cfg.colorize) {
        switch (level) {
            case FYET_DEBUG:
                color_start = "\x1b[37m";    /* normal white */
                break;
            case FYET_INFO:
                color_start = "\x1b[37;1m";    /* bright white */
                break;
            case FYET_NOTICE:
                color_start = "\x1b[34;1m";    /* bright blue */
                break;
            case FYET_WARNING:
                color_start = "\x1b[33;1m";    /* bright yellow */
                break;
            case FYET_ERROR:
                color_start = "\x1b[31;1m";    /* bright red */
                break;
            default:    /* handles FYET_MAX */
                break;
        }
        if (color_start)
            color_end = "\x1b[0m";
    }

    rc = fy_diag_printf(diag, "%s" "%*s" "%*s" "%*s" "%*s" "%s" "%s\n",
                        color_start ?: "",
                        source ? diag->cfg.source_width : 0, source ?: "",
                        position ? diag->cfg.position_width : 0, position ?: "",
                        typestr ? diag->cfg.type_width : 0, typestr ?: "",
                        modulestr ? diag->cfg.module_width : 0, modulestr ?: "",
                        msg,
                        color_end ?: "");

    if (rc > 0)
        rc++;

    out:
    /* if it's the first error we're generating set the
     * on_error flag until the top caller clears it
     */
    if (!diag->on_error && fydc->level >= FYET_ERROR)
        diag->on_error = true;

    return rc;
}